

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnforceModuleInstantiationPrefix.cpp
# Opt level: O1

void __thiscall
enforce_module_instantiation_prefix::MainVisitor::handle(MainVisitor *this,InstanceSymbol *instance)

{
  TidyConfig *pTVar1;
  pointer __s2;
  ulong __n;
  InstanceBodySymbol *pIVar2;
  bool bVar3;
  int iVar4;
  Diagnostic *pDVar5;
  Symbol *member;
  Symbol *pSVar6;
  string_view sVar7;
  
  sVar7 = slang::SourceManager::getFileName
                    ((this->super_TidyVisitor).sourceManager.ptr,
                     (instance->super_InstanceSymbolBase).super_Symbol.location);
  bVar3 = TidyVisitor::skip(&this->super_TidyVisitor,sVar7);
  if ((!bVar3) && (bVar3 = slang::ast::InstanceSymbol::isModule(instance), bVar3)) {
    pTVar1 = (this->super_TidyVisitor).config;
    __s2 = (pTVar1->checkConfigs).moduleInstantiationPrefix._M_dataplus._M_p;
    __n = (pTVar1->checkConfigs).moduleInstantiationPrefix._M_string_length;
    pIVar2 = instance->body;
    if ((pIVar2->super_Scope).deferredMemberIndex != Invalid) {
      slang::ast::Scope::elaborate(&pIVar2->super_Scope);
    }
    for (pSVar6 = (pIVar2->super_Scope).firstMember; pSVar6 != (Symbol *)0x0;
        pSVar6 = pSVar6->nextInScope) {
      if ((pSVar6->kind == Instance) &&
         (((pSVar6->name)._M_len < __n ||
          ((__n != 0 && (iVar4 = bcmp((pSVar6->name)._M_str,__s2,__n), iVar4 != 0)))))) {
        pDVar5 = slang::Diagnostics::add
                           ((this->super_TidyVisitor).diags,(DiagCode)0x20010,pSVar6->location);
        pDVar5 = slang::Diagnostic::operator<<(pDVar5,pSVar6->name);
        sVar7._M_str = __s2;
        sVar7._M_len = __n;
        slang::Diagnostic::operator<<(pDVar5,sVar7);
      }
    }
  }
  return;
}

Assistant:

void handle(const InstanceSymbol& instance) {
        NEEDS_SKIP_SYMBOL(instance)

        if (!instance.isModule())
            return;

        std::string_view prefix = config.getCheckConfigs().moduleInstantiationPrefix;
        for (auto& member : instance.body.members()) {
            if (member.kind == SymbolKind::Instance && !member.name.starts_with(prefix)) {
                diags.add(diag::EnforcePortSuffix, member.location) << member.name << prefix;
            }
        }
    }